

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9_hashmap_simple_key(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  long lVar1;
  anon_union_8_3_18420de5_for_x aVar2;
  jx9_value *pObj;
  
  if (((nArg < 1) || (((*apArg)->iFlags & 0x40) == 0)) ||
     (lVar1 = *(long *)(((*apArg)->x).iVal + 0x20), lVar1 == 0)) {
    jx9MemObjRelease(pCtx->pRet);
  }
  else if (*(int *)(lVar1 + 8) == 1) {
    aVar2 = *(anon_union_8_3_18420de5_for_x *)(lVar1 + 0x10);
    pObj = pCtx->pRet;
    jx9MemObjRelease(pObj);
    pObj->x = aVar2;
    pObj->iFlags = pObj->iFlags & 0xfffffe90U | 2;
  }
  else {
    jx9_value_string(pCtx->pRet,*(char **)(lVar1 + 0x18),*(int *)(lVar1 + 0x20));
  }
  return 0;
}

Assistant:

static int jx9_hashmap_simple_key(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap_node *pCur;
	jx9_hashmap *pMap;
	if( nArg < 1 ){
		/* Missing arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid hashmap */
	if( !jx9_value_is_json_array(apArg[0]) ){
		/* Invalid argument, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	pCur = pMap->pCur;
	if( pCur == 0 ){
		/* Cursor does not point to anything, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	if( pCur->iType == HASHMAP_INT_NODE){
		/* Key is integer */
		jx9_result_int64(pCtx, pCur->xKey.iKey);
	}else{
		/* Key is blob */
		jx9_result_string(pCtx, 
			(const char *)SyBlobData(&pCur->xKey.sKey), (int)SyBlobLength(&pCur->xKey.sKey));
	}
	return JX9_OK;
}